

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O3

boolean same_price(obj *obj1,obj *obj2)

{
  monst *shkp;
  bill_x *pbVar1;
  monst *shkp_00;
  bill_x *pbVar2;
  
  for (shkp = next_shkp(level->monlist,'\x01'); shkp != (monst *)0x0;
      shkp = next_shkp(shkp->nmon,'\x01')) {
    pbVar1 = onbill(obj1,shkp,'\x01');
    if (pbVar1 != (bill_x *)0x0) {
      pbVar2 = onbill(obj2,shkp,'\x01');
      if (pbVar2 == (bill_x *)0x0) goto LAB_0023b137;
      goto LAB_0023b1bb;
    }
  }
  shkp = (monst *)0x0;
  pbVar1 = (bill_x *)0x0;
LAB_0023b137:
  shkp_00 = next_shkp(level->monlist,'\x01');
  do {
    if (shkp_00 == (monst *)0x0) {
LAB_0023b1a9:
      warning("same_price: object wasn\'t on any bill!");
      return '\0';
    }
    pbVar2 = onbill(obj2,shkp_00,'\x01');
    if (pbVar2 != (bill_x *)0x0) {
      if (pbVar1 != (bill_x *)0x0) {
        if (shkp != shkp_00) {
          return '\0';
        }
LAB_0023b1bb:
        return pbVar1->price == pbVar2->price;
      }
      goto LAB_0023b1a9;
    }
    shkp_00 = next_shkp(shkp_00->nmon,'\x01');
  } while( true );
}

Assistant:

boolean same_price(struct obj *obj1, struct obj *obj2)
{
	struct monst *shkp1, *shkp2;
	struct bill_x *bp1 = 0, *bp2 = 0;
	boolean are_mergable = FALSE;

	/* look up the first object by finding shk whose bill it's on */
	for (shkp1 = next_shkp(level->monlist, TRUE); shkp1;
		shkp1 = next_shkp(shkp1->nmon, TRUE))
	    if ((bp1 = onbill(obj1, shkp1, TRUE)) != 0) break;
	/* second object is probably owned by same shk; if not, look harder */
	if (shkp1 && (bp2 = onbill(obj2, shkp1, TRUE)) != 0) {
	    shkp2 = shkp1;
	} else {
	    for (shkp2 = next_shkp(level->monlist, TRUE); shkp2;
		    shkp2 = next_shkp(shkp2->nmon, TRUE))
		if ((bp2 = onbill(obj2, shkp2, TRUE)) != 0) break;
	}

	if (!bp1 || !bp2) warning("same_price: object wasn't on any bill!");
	else are_mergable = (shkp1 == shkp2 && bp1->price == bp2->price);
	return are_mergable;
}